

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O2

int dosearch0(int aflag)

{
  char cVar1;
  uint uVar2;
  boolean bVar3;
  int iVar4;
  obj *poVar5;
  trap *trap;
  monst *pmVar6;
  int iVar7;
  char x;
  int iVar8;
  char *pcVar9;
  monst *worm;
  int iVar10;
  byte y;
  bool bVar11;
  
  if ((u._1052_1_ & 1) == 0) {
    iVar8 = 0;
    if (((uwep != (obj *)0x0) && (iVar8 = 0, uwep->oartifact != '\0')) &&
       (bVar3 = spec_ability(uwep,0x200), bVar3 != '\0')) {
      iVar8 = (int)uwep->spe;
    }
    if (((ublindf != (obj *)0x0) && (ublindf->otyp == 0xed)) &&
       (((u.uprops[0x1e].intrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
        (ublindf->oartifact == '\x1d')))) {
      iVar8 = iVar8 + 2;
    }
    iVar7 = 5;
    if (iVar8 < 5) {
      iVar7 = iVar8;
    }
    for (x = u.ux + -1; iVar8 = (int)x, iVar8 < u.ux + 2; x = x + '\x01') {
      for (y = u.uy - 1; iVar10 = (int)(char)y, iVar10 < u.uy + 2; y = y + 1) {
        if ((((byte)(x - 1U) < 0x4f) && (y < 0x15)) && ((y != u.uy || (x != u.ux)))) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00160d34;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00160d2f;
          }
          else {
LAB_00160d2f:
            if (ublindf == (obj *)0x0) {
              if (aflag != 0) goto LAB_00160d76;
            }
            else {
LAB_00160d34:
              if ((aflag != 0) || (ublindf->oartifact == '\x1d')) goto LAB_00160d76;
            }
            feel_location(x,y);
          }
LAB_00160d76:
          cVar1 = level->locations[iVar8][iVar10].typ;
          if (cVar1 == '\x10') {
            iVar4 = rnl(7 - iVar7);
            if (iVar4 == 0) {
              level->locations[iVar8][iVar10].typ = '\x18';
              unblock_point(iVar8,iVar10);
              exercise(2,'\x01');
              nomul(0,(char *)0x0);
              newsym(iVar8,iVar10);
              if (flags.verbose != '\0') {
                pcVar9 = "You find a secret passage.";
                goto LAB_0016104c;
              }
            }
          }
          else if (cVar1 == '\x0f') {
            iVar4 = rnl(7 - iVar7);
            if (iVar4 != 0) goto LAB_00160d14;
            cvt_sdoor_to_door(level->locations[iVar8] + iVar10,&u.uz);
            exercise(2,'\x01');
            nomul(0,(char *)0x0);
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00160e11;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00160e08;
LAB_0016101a:
              newsym(iVar8,iVar10);
            }
            else {
LAB_00160e08:
              if (ublindf == (obj *)0x0) {
                if (aflag != 0) goto LAB_0016101a;
              }
              else {
LAB_00160e11:
                if ((aflag != 0) || (ublindf->oartifact == '\x1d')) goto LAB_0016101a;
              }
              feel_location(x,y);
            }
            if (flags.verbose != '\0') {
              pcVar9 = "You find a secret door.";
LAB_0016104c:
              pline(pcVar9);
            }
          }
          else {
            pmVar6 = level->monsters[iVar8][iVar10];
            if (pmVar6 == (monst *)0x0) {
              bVar11 = false;
LAB_00160f3c:
              if ((aflag == 0) && (!bVar11)) {
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00160f68;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00160f5f;
LAB_00160fb9:
                  if ((level->locations[iVar8][iVar10].field_0x6 & 8) != 0) {
                    unmap_object(iVar8,iVar10);
                    newsym(iVar8,iVar10);
                  }
                }
                else {
LAB_00160f5f:
                  if (ublindf != (obj *)0x0) {
LAB_00160f68:
                    if (ublindf->oartifact == '\x1d') goto LAB_00160fb9;
                  }
                }
              }
            }
            else {
              bVar11 = (pmVar6->field_0x61 & 2) == 0;
              worm = pmVar6;
              if (!bVar11) {
                worm = (monst *)0x0;
              }
              if ((aflag != 0) || (worm == (monst *)0x0)) goto LAB_00160f3c;
              if (worm->m_ap_type != '\0') {
                seemimic(worm);
LAB_00160ef5:
                exercise(2,'\x01');
                if (worm->wormno == '\0') {
                  if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_0016114d;
                  if (u.uprops[0x1e].intrinsic == 0) {
                    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016109c;
                    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00161093;
                  }
                  else {
LAB_00161093:
                    if (ublindf == (obj *)0x0) goto LAB_00161199;
LAB_0016109c:
                    if (ublindf->oartifact != '\x1d') goto LAB_00161199;
                  }
                  if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                       (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                      ((viz_array[worm->my][worm->mx] & 1U) != 0)) &&
                     ((worm->data->mflags3 & 0x200) != 0)) goto LAB_0016114d;
LAB_00161199:
                  if (((worm->data->mflags1 & 0x10000) == 0) &&
                     ((poVar5 = which_armor(worm,4), poVar5 == (obj *)0x0 ||
                      (poVar5 = which_armor(worm,4), poVar5->otyp != 0x4f)))) {
                    if (u.uprops[0x1e].intrinsic == 0) {
                      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001611ef;
                      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001611ea;
                    }
                    else {
LAB_001611ea:
                      if (ublindf != (obj *)0x0) {
LAB_001611ef:
                        if (ublindf->oartifact == '\x1d') goto LAB_0016127d;
                      }
                      if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                           (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                           youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
                      goto LAB_0016159b;
                    }
LAB_0016127d:
                    if ((u.uprops[0x19].extrinsic != 0) &&
                       ((u.uprops[0x19].blocked == 0 &&
                        (iVar4 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy),
                        iVar4 < 0x41)))) goto LAB_0016159b;
                  }
                  if ((u.uprops[0x42].intrinsic == 0) &&
                     ((u.uprops[0x42].extrinsic == 0 &&
                      (bVar3 = match_warn_of_mon(worm), bVar3 == '\0')))) {
                    if ((level->locations[iVar8][iVar10].field_0x6 & 8) == 0) {
                      pline("You feel an unseen monster!");
                      map_invisible(x,y);
                      return 1;
                    }
                    goto LAB_00160d14;
                  }
                }
                else {
                  bVar3 = worm_known(level,worm);
                  if (bVar3 == '\0') goto LAB_00161199;
LAB_0016114d:
                  uVar2 = *(uint *)&worm->field_0x60;
                  if ((((uVar2 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                     (u.uprops[0xc].extrinsic == 0)) {
                    if (((uVar2 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                    goto LAB_0016118c;
                    goto LAB_00161199;
                  }
                  if ((uVar2 & 0x280) != 0) goto LAB_00161199;
LAB_0016118c:
                  if ((u._1052_1_ & 0x20) != 0) goto LAB_00161199;
                }
LAB_0016159b:
                if (((worm->data->mflags1 & 0x10000) != 0) ||
                   ((poVar5 = which_armor(worm,4), poVar5 != (obj *)0x0 &&
                    (poVar5 = which_armor(worm,4), poVar5->otyp == 0x4f)))) goto LAB_001616fd;
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001615f5;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001615f0;
                }
                else {
LAB_001615f0:
                  if (ublindf != (obj *)0x0) {
LAB_001615f5:
                    if (ublindf->oartifact == '\x1d') goto LAB_001616cf;
                  }
                  if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                       (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                       youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) {
                    return 1;
                  }
                }
LAB_001616cf:
                if (((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) &&
                   (iVar8 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), iVar8 < 0x41)) {
                  return 1;
                }
LAB_001616fd:
                if (u.uprops[0x42].intrinsic != 0) {
                  return 1;
                }
                if (u.uprops[0x42].extrinsic != 0) {
                  return 1;
                }
                bVar3 = match_warn_of_mon(pmVar6);
                if (bVar3 != '\0') {
                  return 1;
                }
                pcVar9 = a_monnam(pmVar6);
                pline("You find %s.",pcVar9);
                return 1;
              }
              if (worm->wormno == '\0') {
                if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_0016135b;
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001610ea;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001610e1;
                }
                else {
LAB_001610e1:
                  if (ublindf == (obj *)0x0) goto LAB_001613a7;
LAB_001610ea:
                  if (ublindf->oartifact != '\x1d') goto LAB_001613a7;
                }
                if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                     (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                    ((viz_array[worm->my][worm->mx] & 1U) != 0)) &&
                   ((worm->data->mflags3 & 0x200) != 0)) goto LAB_0016135b;
LAB_001613a7:
                if (((worm->data->mflags1 & 0x10000) == 0) &&
                   ((poVar5 = which_armor(worm,4), poVar5 == (obj *)0x0 ||
                    (poVar5 = which_armor(worm,4), poVar5->otyp != 0x4f)))) {
                  if (u.uprops[0x1e].intrinsic == 0) {
                    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001613fd;
                    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001613f8;
                  }
                  else {
LAB_001613f8:
                    if (ublindf != (obj *)0x0) {
LAB_001613fd:
                      if (ublindf->oartifact == '\x1d') goto LAB_00161488;
                    }
                    if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                         (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                         youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
                    goto LAB_001614de;
                  }
LAB_00161488:
                  if ((u.uprops[0x19].extrinsic != 0) &&
                     ((u.uprops[0x19].blocked == 0 &&
                      (iVar4 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), iVar4 < 0x41)
                      ))) goto LAB_001614de;
                }
                if ((u.uprops[0x42].intrinsic == 0) &&
                   ((u.uprops[0x42].extrinsic == 0 &&
                    (bVar3 = match_warn_of_mon(worm), bVar3 == '\0')))) {
                  if (((char)*(uint *)&worm->field_0x60 < '\0') &&
                     (((worm->data->mflags1 & 0x100) != 0 || (worm->data->mlet == '9')))) {
                    *(uint *)&worm->field_0x60 = *(uint *)&worm->field_0x60 & 0xffffff7f;
                  }
                  newsym(iVar8,iVar10);
                  goto LAB_00160ef5;
                }
              }
              else {
                bVar3 = worm_known(level,worm);
                if (bVar3 == '\0') goto LAB_001613a7;
LAB_0016135b:
                uVar2 = *(uint *)&worm->field_0x60;
                if ((((uVar2 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                   (u.uprops[0xc].extrinsic == 0)) {
                  if (((uVar2 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                  goto LAB_0016139a;
                  goto LAB_001613a7;
                }
                if ((uVar2 & 0x280) != 0) goto LAB_001613a7;
LAB_0016139a:
                if ((u._1052_1_ & 0x20) != 0) goto LAB_001613a7;
              }
            }
LAB_001614de:
            trap = t_at(level,iVar8,iVar10);
            if (((trap != (trap *)0x0) && ((trap->field_0x8 & 0x20) == 0)) &&
               (iVar10 = rnl(8), iVar10 == 0)) {
              nomul(0,(char *)0x0);
              if ((trap->field_0x8 & 0x1f) == 0x14) {
                pmVar6 = activate_statue_trap(trap,x,y,'\0');
                if (pmVar6 == (monst *)0x0) {
                  return 1;
                }
                exercise(2,'\x01');
                return 1;
              }
              find_trap(trap);
            }
          }
        }
LAB_00160d14:
      }
    }
  }
  else if (aflag == 0) {
    pline("What are you looking for?  The exit?");
  }
  return 1;
}

Assistant:

int dosearch0(int aflag)
{
	xchar x, y;
	struct trap *trap;
	struct monst *mtmp;

	if (u.uswallow) {
		if (!aflag)
			pline("What are you looking for?  The exit?");
	} else {
	    int fund = (uwep && uwep->oartifact &&
		    spec_ability(uwep, SPFX_SEARCH)) ?
		    uwep->spe : 0;
	    if (ublindf && ublindf->otyp == LENSES && !Blind)
		    fund += 2; /* JDS: lenses help searching */
	    if (fund > 5) fund = 5;
	    for (x = u.ux-1; x < u.ux+2; x++)
	      for (y = u.uy-1; y < u.uy+2; y++) {
		if (!isok(x,y)) continue;
		if (x != u.ux || y != u.uy) {
		    if (Blind && !aflag) feel_location(x,y);
		    if (level->locations[x][y].typ == SDOOR) {
			if (rnl(7-fund)) continue;
			cvt_sdoor_to_door(&level->locations[x][y], &u.uz); /* .typ = DOOR */
			exercise(A_WIS, TRUE);
			nomul(0, NULL);
			if (Blind && !aflag)
			    feel_location(x,y);	/* make sure it shows up */
			else
			    newsym(x,y);
			if (flags.verbose) pline("You find a secret door.");
		    } else if (level->locations[x][y].typ == SCORR) {
			if (rnl(7-fund)) continue;
			level->locations[x][y].typ = CORR;
			unblock_point(x,y);	/* vision */
			exercise(A_WIS, TRUE);
			nomul(0, NULL);
			newsym(x,y);
			if (flags.verbose) pline("You find a secret passage.");
		    } else {
		/* Be careful not to find anything in an SCORR or SDOOR */
			if ((mtmp = m_at(level, x, y)) && !aflag) {
			    if (mtmp->m_ap_type) {
				seemimic(mtmp);
		find:		exercise(A_WIS, TRUE);
				if (!canspotmon(level, mtmp)) {
				    if (level->locations[x][y].mem_invis) {
					/* found invisible monster in a square
					 * which already has an 'I' in it.
					 * Logically, this should still take
					 * time and lead to a return(1), but if
					 * we did that the player would keep
					 * finding the same monster every turn.
					 */
					continue;
				    } else {
					pline("You feel an unseen monster!");
					map_invisible(x, y);
				    }
				} else if (!sensemon(mtmp))
				    pline("You find %s.", a_monnam(mtmp));
				return 1;
			    }
			    if (!canspotmon(level, mtmp)) {
				if (mtmp->mundetected &&
				   (is_hider(mtmp->data) || mtmp->data->mlet == S_EEL))
					mtmp->mundetected = 0;
				newsym(x,y);
				goto find;
			    }
			}

			/* see if an invisible monster has moved--if Blind,
			 * feel_location() already did it
			 */
			if (!aflag && !mtmp && !Blind &&
				    level->locations[x][y].mem_invis) {
			    unmap_object(x,y);
			    newsym(x,y);
			}

			if ((trap = t_at(level, x,y)) && !trap->tseen && !rnl(8)) {
			    nomul(0, NULL);

			    if (trap->ttyp == STATUE_TRAP) {
				if (activate_statue_trap(trap, x, y, FALSE))
				    exercise(A_WIS, TRUE);
				return 1;
			    } else {
				find_trap(trap);
			    }
			}
		    }
		}
	    }
	}
	return 1;
}